

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O3

ostream * operator<<(ostream *out,BLH blh)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
  poVar1 = std::ostream::_M_insert<double>(blh.B);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(blh.L);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(blh.H);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return out;
}

Assistant:

ostream & operator<<(ostream &out, const BLH blh)
{
    out << "(" << blh.B << ", " << blh.L << ", " << blh.H << ")" << endl;
    return out;
}